

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

void Scl_LibertyWipeOutComments(char *pBeg,char *pEnd)

{
  char *local_28;
  char *pStart;
  char *pCur;
  char *pEnd_local;
  char *pBeg_local;
  
  pStart = pBeg;
LAB_004a7144:
  if (pEnd + -1 <= pStart) {
    return;
  }
  if ((*pStart == '/') && (pStart[1] == '*')) {
    local_28 = pStart;
    for (; pStart < pEnd + -1; pStart = pStart + 1) {
      if ((*pStart == '*') && (pStart[1] == '/')) goto LAB_004a71aa;
    }
  }
  else if ((*pStart == '/') && (pStart[1] == '/')) {
    local_28 = pStart;
    for (; pStart < pEnd; pStart = pStart + 1) {
      if ((*pStart == '\n') || (pStart == pEnd + -1)) goto LAB_004a723c;
    }
  }
  goto LAB_004a7271;
LAB_004a71aa:
  for (; local_28 < pStart + 2; local_28 = local_28 + 1) {
    if (*local_28 != '\n') {
      *local_28 = ' ';
    }
  }
LAB_004a7271:
  pStart = pStart + 1;
  goto LAB_004a7144;
LAB_004a723c:
  for (; local_28 < pStart; local_28 = local_28 + 1) {
    *local_28 = ' ';
  }
  goto LAB_004a7271;
}

Assistant:

void Scl_LibertyWipeOutComments( char * pBeg, char * pEnd )
{
    char * pCur, * pStart;
    for ( pCur = pBeg; pCur < pEnd-1; pCur++ )
        if ( pCur[0] == '/' && pCur[1] == '*' )
        {
            for ( pStart = pCur; pCur < pEnd-1; pCur++ )
                if ( pCur[0] == '*' && pCur[1] == '/' )
                {
                    for ( ; pStart < pCur + 2; pStart++ )
                    if ( *pStart != '\n' ) *pStart = ' ';
                    break;
                }
        }
        else if ( pCur[0] == '/' && pCur[1] == '/' )
        {
            for ( pStart = pCur; pCur < pEnd; pCur++ )
                if ( pCur[0] == '\n' || pCur == pEnd-1 )
                {
                    for ( ; pStart < pCur; pStart++ ) *pStart = ' ';
                    break;
                }
        }
}